

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildingState.cpp
# Opt level: O3

void BuildingState::CmdBuildRoom
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar2;
  char cVar3;
  unsigned_long __val;
  ostream *poVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  unsigned_long uVar6;
  element_type *extraout_RDX;
  char cVar7;
  shared_ptr<GameData> game_data_00;
  shared_ptr<Room> room;
  shared_ptr<Planet> planet;
  string input_string;
  shared_ptr<Player> player;
  stringstream ss;
  Room *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  shared_ptr<GameData> local_258;
  shared_ptr<Connection> local_248;
  shared_ptr<Connection> local_238;
  shared_ptr<Room> local_228;
  string local_218;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  char local_1d8 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [376];
  
  Connection::GetPlayer
            ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  Entity::GetPlanet((Entity *)local_1f8);
  local_268 = (Room *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Room,std::allocator<Room>>
            (&local_260,&local_268,(allocator<Room> *)local_1b8);
  local_228.super___shared_ptr<Room,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_268;
  local_228.super___shared_ptr<Room,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_260._M_pi
  ;
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268;
  if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_260._M_pi)->_M_use_count = (local_260._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_260._M_pi)->_M_use_count = (local_260._M_pi)->_M_use_count + 1;
    }
  }
  __val = Area::AddRoom((Area *)local_1f8._0_8_,&local_228);
  if (local_228.super___shared_ptr<Room,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.super___shared_ptr<Room,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (input->_M_string_length != 0) {
    pcVar1 = (input->_M_dataplus)._M_p;
    local_1e8._0_8_ = local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e8,pcVar1,pcVar1 + input->_M_string_length);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    Tokenizer::GetFirstToken(&local_218,(string *)local_1e8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_1e8._0_8_,local_1e8._8_8_);
    std::__cxx11::stringbuf::str();
    local_238.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_238.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_238.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_238.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_238.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_238.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_238.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    this = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
    }
    game_data_00.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    game_data_00.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = extraout_RDX;
    CmdLink(&local_218,&local_238,game_data_00);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if (local_238.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_238.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if ((char *)local_1e8._0_8_ != local_1d8) {
      operator_delete((void *)local_1e8._0_8_);
    }
  }
  cVar7 = '\x01';
  if (9 < __val) {
    uVar6 = __val;
    cVar3 = '\x04';
    do {
      cVar7 = cVar3;
      if (uVar6 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_001627e4;
      }
      if (uVar6 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_001627e4;
      }
      if (uVar6 < 10000) goto LAB_001627e4;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar7 + '\x04';
    } while (bVar2);
    cVar7 = cVar7 + '\x01';
  }
LAB_001627e4:
  local_1b8._0_8_ = (element_type *)local_1a8;
  std::__cxx11::string::_M_construct((ulong)local_1b8,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1b8._0_8_,local_1b8._8_4_,__val);
  local_248.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_248.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_248.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_248.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_248.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_248.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_248.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_258.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_258.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_258.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_258.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_258.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_258.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_258.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
  }
  PlayingState::CmdGoto((string *)local_1b8,&local_248,&local_258);
  if (local_258.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (local_248.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((element_type *)local_1b8._0_8_ != (element_type *)local_1a8) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
  }
  if (local_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0._M_pi);
  }
  return;
}

Assistant:

void BuildingState::CmdBuildRoom(const std::string &input, std::shared_ptr<Connection> connection,
                                 std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto planet = player->GetPlanet();
    std::shared_ptr<Room> room = std::make_shared<Room>();
    u_long room_num = planet->AddRoom(room);
    if(input.length() > 0)
    {
        std::string input_string = std::string(input);
        std::stringstream ss;
        ss << Tokenizer::GetFirstToken(input_string) << " ";
        ss << room_num << " ";
        ss << input_string;
        CmdLink(ss.str(), connection, game_data);
    }
    CmdGoto(std::to_string(room_num), connection, game_data);
}